

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double * multinomial_covariance(int a,int b,double *c)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  
  pdVar2 = (double *)operator_new__((ulong)(uint)(b * b) << 3);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < b) {
    uVar4 = (ulong)(uint)b;
  }
  pdVar5 = pdVar2;
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    pdVar6 = pdVar5;
    for (uVar7 = 0; (uint)b != uVar7; uVar7 = uVar7 + 1) {
      dVar1 = c[uVar3];
      if (uVar3 == uVar7) {
        pdVar2[uVar3 * ((long)b + 1)] = dVar1 * (double)a * (1.0 - dVar1);
      }
      else {
        *pdVar6 = dVar1 * -(double)a * c[uVar7];
      }
      pdVar6 = pdVar6 + b;
    }
    pdVar5 = pdVar5 + 1;
  }
  return pdVar2;
}

Assistant:

double *multinomial_covariance ( int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_COVARIANCE returns the covariances of the Multinomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//
//    Input, int B, the number of outcomes possible on one trial.
//    1 <= B.
//
//    Input, double C(B).  C(I) is the probability of outcome I on
//    any trial.
//    0.0 <= C(I) <= 1.0,
//    SUM ( 1 <= I <= B) C(I) = 1.0.
//
//    Output, double MULTINOMIAL_COVARIANCE[B*B], the covariance matrix.
//
{
  double *covariance;
  int i;
  int j;

  covariance = new double[b*b];

  for ( i = 0; i < b; i++)
  {
    for ( j = 0; j < b; j++ )
    {
      if ( i == j )
      {
        covariance[i+j*b] = static_cast<double>(a ) * c[i] * ( 1.0 - c[i] );
      }
      else
      {
        covariance[i+j*b] = - static_cast<double>(a ) * c[i] * c[j];
      }
    }
  }

  return covariance;
}